

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O2

void duckdb::DuckDBColumnsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  int iVar1;
  GlobalTableFunctionState *pGVar2;
  reference pvVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  _func_int **start_col;
  ulong uVar5;
  _func_int **end_col;
  _func_int **__n;
  ulong start_index;
  ColumnHelper local_40;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *local_38;
  
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
             (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3)) {
    local_38 = (vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)(pGVar2 + 1);
    start_index = 0;
    start_col = pGVar2[5]._vptr_GlobalTableFunctionState;
    do {
      end_col = start_col;
      if (((_func_int **)
           ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
            (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) <= __n) || (0x7ff < start_index))
      break;
      pvVar3 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::get<true>
                         (local_38,(size_type)__n);
      ColumnHelper::Create(&local_40,pvVar3->_M_data);
      pCVar4 = unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
               operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                           *)&local_40);
      iVar1 = (*pCVar4->_vptr_ColumnHelper[3])(pCVar4);
      uVar5 = (CONCAT44(extraout_var,iVar1) - (long)start_col) + start_index;
      if (uVar5 < 0x801) {
        output->count = uVar5;
        pCVar4 = unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
                 operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                             *)&local_40);
        ColumnHelper::WriteColumns
                  (pCVar4,start_index,(idx_t)start_col,CONCAT44(extraout_var,iVar1),output);
        __n = (_func_int **)((long)__n + 1);
        end_col = (_func_int **)0x0;
        start_index = uVar5;
      }
      else {
        output->count = 0x800;
        pCVar4 = unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>::
                 operator->((unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true>
                             *)&local_40);
        end_col = (_func_int **)((long)start_col + (0x800 - start_index));
        ColumnHelper::WriteColumns(pCVar4,start_index,(idx_t)start_col,(idx_t)end_col,output);
      }
      if (local_40._vptr_ColumnHelper != (_func_int **)0x0) {
        (**(code **)(*local_40._vptr_ColumnHelper + 8))();
      }
      start_col = end_col;
    } while (uVar5 < 0x801);
    pGVar2[4]._vptr_GlobalTableFunctionState = __n;
    pGVar2[5]._vptr_GlobalTableFunctionState = end_col;
  }
  return;
}

Assistant:

void DuckDBColumnsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBColumnsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}

	// We need to track the offset of the relation we're writing as well as the last column
	// we wrote from that relation (if any); it's possible that we can fill up the output
	// with a partial list of columns from a relation and will need to pick up processing the
	// next chunk at the same spot.
	idx_t next = data.offset;
	idx_t column_offset = data.column_offset;
	idx_t index = 0;
	while (next < data.entries.size() && index < STANDARD_VECTOR_SIZE) {
		auto column_helper = ColumnHelper::Create(data.entries[next].get());
		idx_t columns = column_helper->NumColumns();

		// Check to see if we are going to exceed the maximum index for a DataChunk
		if (index + (columns - column_offset) > STANDARD_VECTOR_SIZE) {
			idx_t column_limit = column_offset + (STANDARD_VECTOR_SIZE - index);
			output.SetCardinality(STANDARD_VECTOR_SIZE);
			column_helper->WriteColumns(index, column_offset, column_limit, output);

			// Make the current column limit the column offset when we process the next chunk
			column_offset = column_limit;
			break;
		} else {
			// Otherwise, write all of the columns from the current relation and
			// then move on to the next one.
			output.SetCardinality(index + (columns - column_offset));
			column_helper->WriteColumns(index, column_offset, columns, output);
			index += columns - column_offset;
			next++;
			column_offset = 0;
		}
	}
	data.offset = next;
	data.column_offset = column_offset;
}